

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_helpers.hpp
# Opt level: O0

void sdglib::read_flat_vectorvector<ReadMapping>
               (ifstream *ifs,
               vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
               *vv)

{
  bool bVar1;
  iterator v_00;
  iterator __lhs;
  ifstream *in_RSI;
  char *in_RDI;
  vector<ReadMapping,_std::allocator<ReadMapping>_> *v;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  *__range3;
  uint64_t count;
  reference in_stack_ffffffffffffffc8;
  size_type in_stack_ffffffffffffffe8;
  
  std::istream::read(in_RDI,(long)&stack0xffffffffffffffe8);
  std::
  vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  ::resize((vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
            *)in_RSI,in_stack_ffffffffffffffe8);
  if (in_stack_ffffffffffffffe8 != 0) {
    v_00 = std::
           vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
           ::begin((vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
                    *)in_stack_ffffffffffffffc8);
    __lhs = std::
            vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
            ::end((vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
                   *)in_stack_ffffffffffffffc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_*,_std::vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>_>
                               *)__lhs._M_current,
                              (__normal_iterator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_*,_std::vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>_>
                               *)in_stack_ffffffffffffffc8), bVar1) {
      in_stack_ffffffffffffffc8 =
           __gnu_cxx::
           __normal_iterator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_*,_std::vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>_>
           ::operator*((__normal_iterator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_*,_std::vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>_>
                        *)&stack0xffffffffffffffd8);
      read_flat_vector<ReadMapping>(in_RSI,v_00._M_current);
      __gnu_cxx::
      __normal_iterator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_*,_std::vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>_>
      ::operator++((__normal_iterator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_*,_std::vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>_>
                    *)&stack0xffffffffffffffd8);
    }
  }
  return;
}

Assistant:

inline void read_flat_vectorvector(std::ifstream &ifs, std::vector<std::vector<T>> &vv) {
        uint64_t count;
        ifs.read(reinterpret_cast<char *>(&count),sizeof(count));
        vv.resize(count);
        if (count > 0) for (auto &v:vv) read_flat_vector<T>(ifs,v);
    }